

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSorter.cpp
# Opt level: O0

void sortHeaders(vector<Header,_std::allocator<Header>_> *headers)

{
  bool bVar1;
  vector<Header,_std::allocator<Header>_> *headers_local;
  
  do {
    bVar1 = anon_unknown.dwarf_124ef::isSorted(headers);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void sortHeaders(std::vector<Header>& headers)
{
    /*
    std::vector<Header> sortedHeaders;

    for (auto& header : headers) {
        bool hasDependancy = false;
        std::cout << "ITR\n";
        for (int i = 0; i < sortedHeaders.size(); i++) {
            auto& d = header.getDependancies();
            if (d.find(sortedHeaders[i].getID()) != d.end()) {
                sortedHeaders.insert(sortedHeaders.begin(), header);
                hasDependancy = true;
                break;
            }
        }
        if (!hasDependancy) {
            sortedHeaders.push_back(header);
        }
    }

    headers = sortedHeaders;
    */
   while (!isSorted(headers));
}